

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gensprep.c
# Opt level: O1

void normalizationCorrectionsLineFn
               (void *context,char *(*fields) [2],int32_t fieldCount,UErrorCode *pErrorCode)

{
  char *s;
  undefined8 uVar1;
  undefined8 uVar2;
  FILE *__stream;
  int32_t iVar3;
  int iVar4;
  ulong uVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  UErrorCode *pErrorCode_00;
  UStringPrepType type;
  int iVar9;
  UErrorCode *versionString;
  ulong unaff_R14;
  UVersionInfo version;
  UVersionInfo thisVersion;
  char *end;
  uint32_t mapping [40];
  uint8_t auStack_1dc [4];
  UErrorCode *pUStack_1d8;
  uint32_t uStack_1c8;
  uint32_t uStack_1c4;
  ulong uStack_1c0;
  char *pcStack_1b8;
  uint32_t auStack_1b0 [42];
  UErrorCode *pUStack_108;
  byte local_d8;
  byte local_d7;
  byte local_d4;
  byte local_d3;
  char *local_d0;
  uint32_t local_c8 [42];
  
  pErrorCode_00 = pErrorCode;
  uVar5 = strtoul((*fields)[0],&local_d0,0x10);
  if (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    pErrorCode_00 = pErrorCode;
    iVar3 = u_parseCodePoints(fields[1][0],local_c8,0x28,pErrorCode);
    u_versionFromString_63(&local_d8,fields[3][0]);
    u_versionFromString_63(&local_d4,"3.2.0");
    versionString = (UErrorCode *)(ulong)(uint)*pErrorCode;
    unaff_R14 = uVar5;
    if (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR) {
      if ((local_d4 < local_d8) || ((local_d8 == local_d4 && (local_d3 < local_d7)))) {
        storeMapping((uint32_t)uVar5,local_c8,iVar3,USPREP_MAP,pErrorCode);
      }
      setUnicodeVersionNC(&local_d8);
      return;
    }
  }
  else {
    versionString = pErrorCode;
    normalizationCorrectionsLineFn_cold_2();
  }
  normalizationCorrectionsLineFn_cold_1();
  uStack_1c4 = 0;
  uStack_1c8 = 0;
  pUStack_1d8 = (UErrorCode *)0x109ed6;
  pUStack_108 = pErrorCode;
  pcVar6 = u_skipWhitespace(*(char **)versionString);
  if (*pcVar6 == '@') {
    pcVar6 = pcVar6 + 1;
    iVar9 = versionString[2] - (int)pcVar6;
    if (8 < iVar9) {
      pUStack_1d8 = (UErrorCode *)0x109f01;
      iVar4 = strncmp(pcVar6,"normalize",9);
      if (iVar4 == 0) {
        options[8].doesOccur = '\x01';
        return;
      }
    }
    if (9 < iVar9) {
      pUStack_1d8 = (UErrorCode *)0x109f1e;
      iVar9 = strncmp(pcVar6,"check-bidi",10);
      if (iVar9 == 0) {
        options[10].doesOccur = '\x01';
        return;
      }
    }
    pUStack_1d8 = (UErrorCode *)0x109f42;
    strprepProfileLineFn_cold_1();
  }
  s = *(char **)(versionString + 4);
  pcVar8 = *(char **)(versionString + 8);
  pUStack_1d8 = (UErrorCode *)0x109f59;
  pcVar7 = strstr(pcVar8,"UNASSIGNED");
  if (pcVar7 == (char *)0x0) {
    pUStack_1d8 = (UErrorCode *)0x109f98;
    pcVar7 = strstr(pcVar8,"PROHIBITED");
    if (pcVar7 == (char *)0x0) {
      pUStack_1d8 = (UErrorCode *)0x109ffc;
      pcVar8 = strstr(pcVar8,"MAP");
      if (pcVar8 == (char *)0x0) {
        *pErrorCode_00 = U_INVALID_FORMAT_ERROR;
      }
      else {
        pUStack_1d8 = (UErrorCode *)0x10a016;
        uStack_1c0 = strtoul(pcVar6,&pcStack_1b8,0x10);
        if ((pcStack_1b8 <= pcVar6) || (pcStack_1b8 != *(char **)(versionString + 2))) {
          pUStack_1d8 = (UErrorCode *)0x10a0ca;
          strprepProfileLineFn_cold_4();
          pUStack_1d8 = pErrorCode_00;
          u_versionFromString_63(auStack_1dc,(char *)versionString);
          dataInfo.dataVersion[0] = auStack_1dc[0];
          dataInfo.dataVersion[1] = auStack_1dc[1];
          dataInfo.dataVersion[2] = auStack_1dc[2];
          dataInfo.dataVersion[3] = auStack_1dc[3];
          return;
        }
        pUStack_1d8 = (UErrorCode *)0x10a04a;
        iVar3 = u_parseCodePoints(s,auStack_1b0,0x28,pErrorCode_00);
        pUStack_1d8 = (UErrorCode *)0x10a061;
        storeMapping((uint32_t)uStack_1c0,auStack_1b0,iVar3,USPREP_MAP,pErrorCode_00);
      }
      goto LAB_00109fd1;
    }
    pUStack_1d8 = (UErrorCode *)0x109fb2;
    u_parseCodePointRange(pcVar6,&uStack_1c4,&uStack_1c8,pErrorCode_00);
    if (U_ZERO_ERROR < *pErrorCode_00) {
      pUStack_1d8 = (UErrorCode *)0x10a080;
      strprepProfileLineFn_cold_3();
      return;
    }
    type = USPREP_PROHIBITED;
  }
  else {
    pUStack_1d8 = (UErrorCode *)0x109f73;
    u_parseCodePointRange(pcVar6,&uStack_1c4,&uStack_1c8,pErrorCode_00);
    if (U_ZERO_ERROR < *pErrorCode_00) {
      pUStack_1d8 = (UErrorCode *)0x10a076;
      strprepProfileLineFn_cold_2();
      return;
    }
    type = USPREP_UNASSIGNED;
  }
  pUStack_1d8 = (UErrorCode *)0x109fd1;
  storeRange(uStack_1c4,uStack_1c8,type,pErrorCode_00);
LAB_00109fd1:
  __stream = _stderr;
  if (*pErrorCode_00 < U_ILLEGAL_ARGUMENT_ERROR) {
    return;
  }
  uVar1 = *(undefined8 *)versionString;
  uVar2 = *(undefined8 *)(versionString + 8);
  pUStack_1d8 = (UErrorCode *)0x10a09b;
  pcVar6 = u_errorName_63(*pErrorCode_00);
  pUStack_1d8 = (UErrorCode *)0x10a0b8;
  fprintf(__stream,"gensprep error parsing  %s line %s at %s. Error: %s\n",unaff_R14,uVar1,uVar2,
          pcVar6);
  pUStack_1d8 = (UErrorCode *)0x10a0bf;
  exit(*pErrorCode_00);
}

Assistant:

static void U_CALLCONV
normalizationCorrectionsLineFn(void *context,
                    char *fields[][2], int32_t fieldCount,
                    UErrorCode *pErrorCode) {
    uint32_t mapping[40];
    char *end, *s;
    uint32_t code;
    int32_t length;
    UVersionInfo version;
    UVersionInfo thisVersion;

    /* get the character code, field 0 */
    code=(uint32_t)uprv_strtoul(fields[0][0], &end, 16);
    if(U_FAILURE(*pErrorCode)) {
        fprintf(stderr, "gensprep: error parsing NormalizationCorrections.txt mapping at %s\n", fields[0][0]);
        exit(*pErrorCode);
    }
    /* Original (erroneous) decomposition */
    s = fields[1][0];

    /* parse the mapping string */
    length=u_parseCodePoints(s, mapping, sizeof(mapping)/4, pErrorCode);

    /* ignore corrected decomposition */

    u_versionFromString(version,fields[3][0] );
    u_versionFromString(thisVersion, "3.2.0");



    if(U_FAILURE(*pErrorCode)) {
        fprintf(stderr, "gensprep error parsing NormalizationCorrections.txt of U+%04lx - %s\n",
                (long)code, u_errorName(*pErrorCode));
        exit(*pErrorCode);
    }

    /* store the mapping */
    if( version[0] > thisVersion[0] || 
        ((version[0]==thisVersion[0]) && (version[1] > thisVersion[1]))
        ){
        storeMapping(code,mapping, length, USPREP_MAP, pErrorCode);
    }
    setUnicodeVersionNC(version);
}